

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_LzmaEnc.cpp
# Opt level: O2

void crnlib::FillDistancesPrices(CLzmaEnc *p)

{
  byte bVar1;
  UInt32 UVar2;
  long lVar3;
  int numBitLevels;
  ulong uVar4;
  CLzmaEnc *pCVar5;
  UInt32 (*paUVar6) [64];
  uint uVar7;
  UInt32 (*paUVar8) [128];
  ulong uVar9;
  long lVar10;
  long lVar11;
  UInt32 tempPrices [128];
  
  for (lVar11 = 0; lVar11 != 0x7c; lVar11 = lVar11 + 1) {
    bVar1 = p->g_FastPos[lVar11 + 4];
    numBitLevels = (bVar1 >> 1) - 1;
    uVar7 = (bVar1 & 1 | 2) << ((byte)numBitLevels & 0x1f);
    UVar2 = RcTree_ReverseGetPrice
                      ((UInt16 *)((long)p + ((ulong)uVar7 * 2 - (ulong)((uint)bVar1 * 2)) + 0x34146)
                       ,numBitLevels,((int)lVar11 - uVar7) + 4,p->ProbPrices);
    tempPrices[lVar11 + 4] = UVar2;
  }
  paUVar8 = p->distancesPrices;
  lVar11 = 0;
  pCVar5 = p;
  paUVar6 = p->posSlotPrices;
  for (lVar10 = 0; lVar10 != 4; lVar10 = lVar10 + 1) {
    for (uVar9 = 0; uVar4 = (ulong)p->distTableSize, uVar9 < uVar4; uVar9 = uVar9 + 1) {
      UVar2 = RcTree_GetPrice(p->posSlotEncoder[lVar10],6,(UInt32)uVar9,p->ProbPrices);
      (*paUVar6)[uVar9] = UVar2;
    }
    uVar7 = 0x70;
    for (lVar3 = 0xcbef; lVar3 - 0xcbe1U < uVar4; lVar3 = lVar3 + 1) {
      *(uint *)((long)&(pCVar5->matchFinder).Init + lVar3 * 4) =
           (uVar7 & 0xfffffff0) + *(int *)((long)&(pCVar5->matchFinder).Init + lVar3 * 4) + -0x50;
      uVar4 = (ulong)p->distTableSize;
      uVar7 = uVar7 + 8;
    }
    for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
      (*paUVar8)[lVar3] = (*paUVar6)[lVar3];
    }
    for (lVar3 = 0; lVar3 != 0x7c; lVar3 = lVar3 + 1) {
      *(UInt32 *)((long)p->distancesPrices[0] + lVar3 * 4 + lVar11 + 0x10) =
           tempPrices[lVar3 + 4] + p->posSlotPrices[lVar10][p->g_FastPos[lVar3 + 4]];
    }
    paUVar6 = paUVar6 + 1;
    pCVar5 = (CLzmaEnc *)((pCVar5->matchFinderBase).crc + 0x11);
    paUVar8 = paUVar8 + 1;
    lVar11 = lVar11 + 0x200;
  }
  p->matchPriceCount = 0;
  return;
}

Assistant:

static void FillDistancesPrices(CLzmaEnc* p) {
  UInt32 tempPrices[kNumFullDistances];
  UInt32 i, lenToPosState;
  for (i = kStartPosModelIndex; i < kNumFullDistances; i++) {
    UInt32 posSlot = GetPosSlot1(i);
    UInt32 footerBits = ((posSlot >> 1) - 1);
    UInt32 base = ((2 | (posSlot & 1)) << footerBits);
    tempPrices[i] = RcTree_ReverseGetPrice(p->posEncoders + base - posSlot - 1, footerBits, i - base, p->ProbPrices);
  }

  for (lenToPosState = 0; lenToPosState < kNumLenToPosStates; lenToPosState++) {
    UInt32 posSlot;
    const CLzmaProb* encoder = p->posSlotEncoder[lenToPosState];
    UInt32* posSlotPrices = p->posSlotPrices[lenToPosState];
    for (posSlot = 0; posSlot < p->distTableSize; posSlot++)
      posSlotPrices[posSlot] = RcTree_GetPrice(encoder, kNumPosSlotBits, posSlot, p->ProbPrices);
    for (posSlot = kEndPosModelIndex; posSlot < p->distTableSize; posSlot++)
      posSlotPrices[posSlot] += ((((posSlot >> 1) - 1) - kNumAlignBits) << kNumBitPriceShiftBits);

    {
      UInt32* distancesPrices = p->distancesPrices[lenToPosState];
      UInt32 i;
      for (i = 0; i < kStartPosModelIndex; i++)
        distancesPrices[i] = posSlotPrices[i];
      for (; i < kNumFullDistances; i++)
        distancesPrices[i] = posSlotPrices[GetPosSlot1(i)] + tempPrices[i];
    }
  }
  p->matchPriceCount = 0;
}